

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.cpp
# Opt level: O0

void __thiscall curlpp::internal::SList::constructFrom(SList *this,curl_slist *list)

{
  undefined8 *in_RSI;
  curl_slist *c;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff90;
  value_type *__x;
  allocator *this_00;
  SList *in_stack_ffffffffffffffc0;
  string local_38 [32];
  undefined8 *local_18;
  undefined8 *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(in_stack_ffffffffffffff90);
  for (local_18 = local_10; local_18 != (undefined8 *)0x0; local_18 = (undefined8 *)local_18[1]) {
    __x = (value_type *)*local_18;
    this_00 = (allocator *)&stack0xffffffffffffffc7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,(char *)__x,this_00);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00,__x);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  }
  update(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void 
SList::constructFrom(curl_slist * list)
{
	mData.clear();

	curl_slist * c = list;
	while(c)
	{
		mData.push_back(c->data);
		c = c->next;
	}

	update();
}